

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.c
# Opt level: O0

nh_drawing_info * nh_get_drawing_info(void)

{
  nh_drawing_info *pnVar1;
  nh_symdef *pnVar2;
  char *pcVar3;
  nh_drawing_info *di;
  nh_symdef *tmp;
  int i;
  
  pnVar1 = (nh_drawing_info *)xmalloc(0x90);
  pnVar1->num_bgelements = 0x30;
  pnVar1->bgelements = defsyms;
  pnVar1->num_traps = 0x18;
  pnVar1->traps = trapsyms;
  pnVar1->num_objects = 0x21a;
  pnVar2 = (nh_symdef *)xmalloc(pnVar1->num_objects * 0x18);
  for (tmp._4_4_ = 0; tmp._4_4_ < pnVar1->num_objects; tmp._4_4_ = tmp._4_4_ + 1) {
    pnVar2[tmp._4_4_].ch = ""[(int)const_objects[tmp._4_4_].oc_class];
    pcVar3 = make_object_name(tmp._4_4_);
    pnVar2[tmp._4_4_].symname = pcVar3;
    pnVar2[tmp._4_4_].color = (uint)const_objects[tmp._4_4_].oc_color;
  }
  pnVar2[0x214].ch = '0';
  pnVar1->objects = pnVar2;
  pnVar2 = (nh_symdef *)xmalloc(0x18);
  pnVar2->ch = 'I';
  pnVar2->color = 8;
  pnVar2->symname = "invisible monster";
  pnVar1->invis = pnVar2;
  pnVar1->num_monsters = 0x193;
  pnVar2 = (nh_symdef *)xmalloc(pnVar1->num_monsters * 0x18);
  for (tmp._4_4_ = 0; tmp._4_4_ < pnVar1->num_monsters; tmp._4_4_ = tmp._4_4_ + 1) {
    pnVar2[tmp._4_4_].ch = ""[(int)mons[tmp._4_4_].mlet];
    pcVar3 = make_mon_name(tmp._4_4_);
    pnVar2[tmp._4_4_].symname = pcVar3;
    pnVar2[tmp._4_4_].color = (uint)mons[tmp._4_4_].mcolor;
  }
  pnVar1->monsters = pnVar2;
  pnVar1->num_warnings = 6;
  pnVar1->warnings = warnsyms;
  pnVar1->num_expltypes = 7;
  pnVar1->expltypes = expltypes;
  pnVar1->explsyms = explsyms;
  pnVar1->num_zaptypes = 8;
  pnVar1->zaptypes = zaptypes;
  pnVar1->zapsyms = zapsyms;
  pnVar1->breathsyms = breathsyms;
  pnVar1->num_effects = 9;
  pnVar1->effects = effectsyms;
  pnVar1->swallowsyms = swallowsyms;
  pnVar1->bg_feature_offset = 0x19;
  return pnVar1;
}

Assistant:

struct nh_drawing_info *nh_get_drawing_info(void)
{
    int i;
    struct nh_symdef *tmp;
    struct nh_drawing_info *di = xmalloc(sizeof(struct nh_drawing_info));
    
    di->num_bgelements = SIZE(defsyms);
    di->bgelements = (struct nh_symdef *)defsyms;
    
    di->num_traps = SIZE(trapsyms);
    di->traps = (struct nh_symdef *)trapsyms;
    
    di->num_objects = NUM_OBJECTS;
    tmp = xmalloc(sizeof(struct nh_symdef) * di->num_objects);
    for (i = 0; i < di->num_objects; i++) {
	tmp[i].ch = def_oc_syms[(int)const_objects[i].oc_class];
	tmp[i].symname = make_object_name(i);
	tmp[i].color = const_objects[i].oc_color;
    }
    /* show boulders as '0' by default */
    tmp[BOULDER].ch = '0';
    di->objects = tmp;
    
    tmp = xmalloc(sizeof(struct nh_symdef));
    tmp->ch = DEF_INVISIBLE;
    tmp->color = NO_COLOR;
    tmp->symname = "invisible monster";
    di->invis = tmp;
    
    di->num_monsters = NUMMONS;
    tmp = xmalloc(sizeof(struct nh_symdef) * di->num_monsters);
    for (i = 0; i < di->num_monsters; i++) {
	tmp[i].ch = def_monsyms[(int)mons[i].mlet];
	tmp[i].symname = make_mon_name(i);
	tmp[i].color = mons[i].mcolor;
    }
    di->monsters = tmp;
    
    di->num_warnings = SIZE(warnsyms);
    di->warnings = (struct nh_symdef *)warnsyms;
    
    di->num_expltypes = SIZE(expltypes);
    di->expltypes = (struct nh_symdef *)expltypes;
    di->explsyms = (struct nh_symdef *)explsyms;
    
    di->num_zaptypes = SIZE(zaptypes);
    di->zaptypes = (struct nh_symdef *)zaptypes;
    di->zapsyms = (struct nh_symdef *)zapsyms;
    di->breathsyms = (struct nh_symdef *)breathsyms;
    
    di->num_effects = SIZE(effectsyms);
    di->effects = (struct nh_symdef *)effectsyms;
    
    di->swallowsyms = (struct nh_symdef *)swallowsyms;
    
    di->bg_feature_offset = DUNGEON_FEATURE_OFFSET;
    
    return di;
}